

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismSearcher::HomomorphismSearcher
          (HomomorphismSearcher *this,HomomorphismModel *m,HomomorphismParams *p,
          DuplicateSolutionFilterer *d,shared_ptr<gss::innards::Proof> *f)

{
  bool bVar1;
  pointer in_RDX;
  pointer in_RSI;
  vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  *in_RDI;
  shared_ptr<gss::innards::Proof> *in_stack_ffffffffffffff98;
  shared_ptr<gss::innards::Proof> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  *__new_size;
  
  (in_RDI->
  super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = in_RSI;
  (in_RDI->
  super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = in_RDX;
  std::function<bool_(const_gss::innards::HomomorphismAssignments_&)>::function
            ((function<bool_(const_gss::innards::HomomorphismAssignments_&)> *)
             &(in_RDI->
              super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage,
             (function<bool_(const_gss::innards::HomomorphismAssignments_&)> *)
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  __new_size = in_RDI + 2;
  std::shared_ptr<gss::innards::Proof>::shared_ptr
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x174871);
  Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>::
  Watches((Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
           *)(in_RDI + 0xd3));
  bVar1 = might_have_watches((HomomorphismParams *)0x174897);
  if (bVar1) {
    *(undefined4 *)
     &in_RDI[0xd4].
      super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
         *(undefined4 *)
          ((long)&(((in_RDI->
                    super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start)->
                  super__List_base<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>
                  )._M_impl._M_node + 0x10);
    std::
    vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
    ::resize(in_RDI,(size_type)__new_size);
  }
  return;
}

Assistant:

HomomorphismSearcher::HomomorphismSearcher(const HomomorphismModel & m, const HomomorphismParams & p,
    const DuplicateSolutionFilterer & d, const std::shared_ptr<Proof> & f) :
    model(m),
    params(p),
    _duplicate_solution_filterer(d),
    proof(f)
{
    if (might_have_watches(params)) {
        watches.table.target_size = model.target_size;
        watches.table.data.resize(model.pattern_size * model.target_size);
    }
}